

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int iBreak)

{
  int iVar1;
  Vdbe *v;
  char *zP4;
  int *piVar2;
  byte bVar3;
  uint p2;
  int iVar4;
  int iVar5;
  Op *pOVar6;
  int iVar7;
  Vdbe *p_00;
  int p3;
  
  v = pParse->pVdbe;
  iVar1 = v->nOp;
  p2 = sqlite3VdbeMakeLabel(v);
  if (regPrev != 0) {
    iVar4 = sqlite3VdbeAddOp3(v,0x14,regPrev,0,0);
    iVar5 = pIn->iSdst;
    iVar7 = pIn->nSdst;
    if (pKeyInfo != (KeyInfo *)0x0) {
      pKeyInfo->nRef = pKeyInfo->nRef + 1;
    }
    iVar5 = sqlite3VdbeAddOp3(v,0x57,iVar5,regPrev + 1,iVar7);
    sqlite3VdbeChangeP4(v,iVar5,(char *)pKeyInfo,-9);
    sqlite3VdbeAddOp3(v,0x10,iVar5 + 2,p2,iVar5 + 2);
    if (v->db->mallocFailed == '\0') {
      iVar5 = v->nOp + -1;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      pOVar6 = v->aOp + iVar5;
    }
    else {
      pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar6->p2 = v->nOp;
    sqlite3VdbeAddOp3(v,0x4e,pIn->iSdst,regPrev + 1,pIn->nSdst + -1);
    sqlite3VdbeAddOp3(v,0x46,1,regPrev,0);
  }
  if (pParse->db->mallocFailed != '\0') {
    return 0;
  }
  if (0 < p->iOffset) {
    sqlite3VdbeAddOp3(v,0x2f,p->iOffset,p2,1);
  }
  switch(pDest->eDest) {
  case '\n':
    iVar5 = pIn->iSdst;
    iVar7 = pDest->iSDParm;
    p_00 = pParse->pVdbe;
    iVar4 = 0x4d;
    p3 = 1;
    goto LAB_00189cb6;
  case '\v':
    if (pParse->nTempReg == '\0') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar5 = pParse->aTempReg[bVar3];
    }
    iVar7 = pIn->nSdst;
    zP4 = pDest->zAffSdst;
    iVar4 = sqlite3VdbeAddOp3(v,0x66,pIn->iSdst,iVar7,iVar5);
    sqlite3VdbeChangeP4(v,iVar4,zP4,iVar7);
    iVar7 = pIn->nSdst;
    iVar4 = sqlite3VdbeAddOp3(v,0x85,pDest->iSDParm,iVar5,pIn->iSdst);
    if (v->db->mallocFailed == '\0') {
      pOVar6 = v->aOp;
      pOVar6[iVar4].p4type = -3;
      pOVar6[iVar4].p4.i = iVar7;
    }
    break;
  case '\f':
    if (pParse->nTempReg == '\0') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar5 = pParse->aTempReg[bVar3];
    }
    if (pParse->nTempReg == '\0') {
      iVar7 = pParse->nMem + 1;
      pParse->nMem = iVar7;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar7 = pParse->aTempReg[bVar3];
    }
    sqlite3VdbeAddOp3(v,0x66,pIn->iSdst,pIn->nSdst,iVar5);
    sqlite3VdbeAddOp3(v,0x79,pDest->iSDParm,iVar7,0);
    sqlite3VdbeAddOp3(v,0x7a,pDest->iSDParm,iVar5,iVar7);
    if (0 < (long)v->nOp) {
      v->aOp[(long)v->nOp + -1].p5 = 8;
    }
    if (iVar7 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar7;
      }
    }
    break;
  case '\r':
    if (pDest->iSdst == 0) {
      iVar5 = sqlite3GetTempRange(pParse,pIn->nSdst);
      pDest->iSdst = iVar5;
      pDest->nSdst = pIn->nSdst;
    }
    sqlite3VdbeAddOp3(pParse->pVdbe,0x4d,pIn->iSdst,pDest->iSdst,pIn->nSdst);
    iVar5 = pDest->iSDParm;
    iVar4 = 0xe;
    iVar7 = 0;
    goto LAB_00189cb3;
  default:
    iVar5 = pIn->iSdst;
    iVar7 = pIn->nSdst;
    iVar4 = 0x51;
LAB_00189cb3:
    p3 = 0;
    p_00 = v;
LAB_00189cb6:
    sqlite3VdbeAddOp3(p_00,iVar4,iVar5,iVar7,p3);
    goto LAB_00189e35;
  }
  if (iVar5 != 0) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = iVar5;
    }
  }
LAB_00189e35:
  if (p->iLimit != 0) {
    sqlite3VdbeAddOp3(v,0x31,p->iLimit,iBreak,0);
  }
  piVar2 = v->pParse->aLabel;
  if (piVar2 != (int *)0x0) {
    piVar2[(int)~p2] = v->nOp;
  }
  sqlite3VdbeAddOp3(v,0x42,regReturn,0,0);
  return iVar1;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(v);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT 
  */
  if( regPrev ){
    int addr1, addr2;
    addr1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev); VdbeCoverage(v);
    addr2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)sqlite3KeyInfoRef(pKeyInfo), P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr2+2, iContinue, addr2+2); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p->iOffset, iContinue);

  assert( pDest->eDest!=SRT_Exists );
  assert( pDest->eDest!=SRT_Table );
  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)".
    */
    case SRT_Set: {
      int r1;
      testcase( pIn->nSdst>1 );
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, 
          r1, pDest->zAffSdst, pIn->nSdst);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pDest->iSDParm, r1,
                           pIn->iSdst, pIn->nSdst);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( pIn->nSdst==1 || pParse->nErr>0 );  testcase( pIn->nSdst!=1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, 1);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pIn->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.  
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}